

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_scripthash.cpp
# Opt level: O0

void __thiscall
ScriptHash_ScriptHash_hex_exception_Test::ScriptHash_ScriptHash_hex_exception_Test
          (ScriptHash_ScriptHash_hex_exception_Test *this)

{
  ScriptHash_ScriptHash_hex_exception_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test =
       (_func_int **)&PTR__ScriptHash_ScriptHash_hex_exception_Test_0088d8f8;
  return;
}

Assistant:

TEST(ScriptHash, ScriptHash_hex_exception) {
  try {
    std::string hex("xxxx");
    ScriptHash script_hash(hex);
  } catch (const cfd::core::CfdException &cfd_except) {
    EXPECT_STREQ(cfd_except.what(), "hex to byte convert error.");
    return;
  }
  ASSERT_TRUE(false);
}